

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

TValue * luaH_getshortstr(Table *t,TString *key)

{
  Node *pNStack_28;
  int nx;
  Node *n;
  TString *key_local;
  Table *t_local;
  
  for (pNStack_28 = t->node + (int)(key->hash & (1 << (t->lsizenode & 0x1f)) - 1U);
      ((pNStack_28->u).key_tt != 'D' || ((TString *)(pNStack_28->u).key_val.gc != key));
      pNStack_28 = pNStack_28 + (pNStack_28->u).next) {
    if ((pNStack_28->u).next == 0) {
      return &absentkey;
    }
  }
  return (TValue *)pNStack_28;
}

Assistant:

const TValue *luaH_getshortstr (Table *t, TString *key) {
  Node *n = hashstr(t, key);
  lua_assert(key->tt == LUA_VSHRSTR);
  for (;;) {  /* check whether 'key' is somewhere in the chain */
    if (keyisshrstr(n) && eqshrstr(keystrval(n), key))
      return gval(n);  /* that's it */
    else {
      int nx = gnext(n);
      if (nx == 0)
        return &absentkey;  /* not found */
      n += nx;
    }
  }
}